

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O2

void __thiscall
cmCTestCoverageHandler::StartCoverageLogXML(cmCTestCoverageHandler *this,cmXMLWriter *xml)

{
  double dVar1;
  allocator local_51;
  string local_50;
  string local_30;
  
  cmCTest::StartXML((this->super_cmCTestGenericHandler).CTest,xml,
                    (this->super_cmCTestGenericHandler).AppendXML);
  std::__cxx11::string::string((string *)&local_50,"CoverageLog",(allocator *)&local_30);
  cmXMLWriter::StartElement(xml,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string((string *)&local_50,"StartDateTime",&local_51);
  cmCTest::CurrentTime_abi_cxx11_(&local_30,(this->super_cmCTestGenericHandler).CTest);
  cmXMLWriter::Element<std::__cxx11::string>(xml,&local_50,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string((string *)&local_50,"StartTime",&local_51);
  dVar1 = cmsys::SystemTools::GetTime();
  local_30._M_dataplus._M_p._0_4_ = (undefined4)(long)dVar1;
  cmXMLWriter::Element<unsigned_int>(xml,&local_50,(uint *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void cmCTestCoverageHandler::StartCoverageLogXML(cmXMLWriter& xml)
{
  this->CTest->StartXML(xml, this->AppendXML);
  xml.StartElement("CoverageLog");
  xml.Element("StartDateTime", this->CTest->CurrentTime());
  xml.Element("StartTime",
              static_cast<unsigned int>(cmSystemTools::GetTime()));
}